

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputParser.cpp
# Opt level: O2

string * __thiscall
InputParser::removeQuotes(string *__return_storage_ptr__,InputParser *this,string *sentence)

{
  char *pcVar1;
  string local_30 [32];
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)sentence);
  pcVar1 = (char *)std::__cxx11::string::at((ulong)__return_storage_ptr__);
  if (*pcVar1 == '\"') {
    pcVar1 = (char *)std::__cxx11::string::at((ulong)__return_storage_ptr__);
    if (*pcVar1 == '\"') {
      std::__cxx11::string::substr((ulong)local_30,(ulong)__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_30);
      std::__cxx11::string::~string(local_30);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string InputParser::removeQuotes(const string &sentence) {
    string ret(sentence);

    if (ret.at(0) == '"' && ret.at(ret.size()-1) == '"')
        ret = ret.substr(1, ret.size()-2);

   return ret;
}